

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O0

int __thiscall hwtest::pgraph::anon_unknown_2::ScanVStateTest::run(ScanVStateTest *this)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  pointer pRVar3;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  *__range3;
  ScanVStateTest *this_local;
  
  if ((this->super_ScanTest).super_Test.chipset.card_type < 3) {
    ::nva_wr32((this->super_ScanTest).super_Test.cnum,0x4006a4,0xf000111);
  }
  pgraph_vstate_regs((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                      *)&__begin3,&(this->super_ScanTest).super_Test.chipset);
  __end3 = std::
           vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
           ::begin((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                    *)&__begin3);
  reg = (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *)
        std::
        vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
        ::end((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               *)&__begin3);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
                                     *)&reg), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
              ::operator*(&__end3);
    pRVar3 = std::
             unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>::
             operator->(this_00);
    uVar2 = (*pRVar3->_vptr_Register[10])
                      (pRVar3,(ulong)(uint)(this->super_ScanTest).super_Test.cnum,
                       &(this->super_ScanTest).super_Test.rnd);
    if ((uVar2 & 1) != 0) {
      (this->super_ScanTest).res = 3;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
    ::operator++(&__end3);
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
             *)&__begin3);
  return (this->super_ScanTest).res;
}

Assistant:

int run() override {
		if (chipset.card_type < 3) {
			nva_wr32(cnum, 0x4006a4, 0x0f000111);
		}
		for (auto &reg : pgraph_vstate_regs(chipset)) {
			if (reg->scan_test(cnum, rnd))
				res = HWTEST_RES_FAIL;
		}
		return res;
	}